

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::reallocate
          (array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute> *this,
          u32 new_size)

{
  SAttribute *pSVar1;
  SAttribute *pSVar2;
  void *pvVar3;
  uint uVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  u32 uVar7;
  long lVar8;
  long lVar9;
  
  pSVar1 = this->data;
  lVar8 = (ulong)new_size * 0x20;
  puVar5 = (ulong *)operator_new__(lVar8 + 8);
  *puVar5 = (ulong)new_size;
  if (new_size != 0) {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)puVar5 + lVar9 + 8) = 0;
      *(undefined8 *)((long)puVar5 + lVar9 + 0x10) = 0x100000001;
      puVar6 = (undefined8 *)operator_new__(8);
      *(undefined8 **)((long)puVar5 + lVar9 + 8) = puVar6;
      *puVar6 = 0;
      *(undefined8 *)((long)puVar5 + lVar9 + 0x18) = 0;
      *(undefined8 *)((long)puVar5 + lVar9 + 0x20) = 0x100000001;
      puVar6 = (undefined8 *)operator_new__(8);
      *(undefined8 **)((long)puVar5 + lVar9 + 0x18) = puVar6;
      *puVar6 = 0;
      lVar9 = lVar9 + 0x20;
    } while (lVar8 != lVar9);
  }
  this->data = (SAttribute *)(puVar5 + 1);
  this->allocated = new_size;
  uVar4 = this->used;
  uVar7 = new_size;
  if (uVar4 < new_size) {
    uVar7 = uVar4;
  }
  if (0 < (int)uVar7) {
    lVar8 = 0;
    do {
      pSVar2 = this->data;
      string<unsigned_long>::operator=
                ((string<unsigned_long> *)((long)&(pSVar2->Name).array + lVar8),
                 (string<unsigned_long> *)((long)&(pSVar1->Name).array + lVar8));
      string<unsigned_long>::operator=
                ((string<unsigned_long> *)((long)&(pSVar2->Value).array + lVar8),
                 (string<unsigned_long> *)((long)&(pSVar1->Value).array + lVar8));
      lVar8 = lVar8 + 0x20;
    } while ((ulong)uVar7 << 5 != lVar8);
    new_size = this->allocated;
    uVar4 = this->used;
  }
  if (new_size < uVar4) {
    this->used = new_size;
  }
  if (pSVar1 != (SAttribute *)0x0) {
    lVar8._0_4_ = pSVar1[-1].Value.allocated;
    lVar8._4_4_ = pSVar1[-1].Value.used;
    if (lVar8 != 0) {
      lVar8 = lVar8 << 5;
      do {
        pvVar3 = *(void **)((long)pSVar1 + lVar8 + -0x10);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        pvVar3 = *(void **)((long)&pSVar1[-1].Name.array + lVar8);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        lVar8 = lVar8 + -0x20;
      } while (lVar8 != 0);
    }
    operator_delete__(&pSVar1[-1].Value.allocated);
    return;
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}